

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void filter(double *sig,int len_sig,double *filt,int len_filt,double *oup)

{
  double *oup_00;
  double *temp;
  int i;
  int N;
  double *oup_local;
  int len_filt_local;
  double *filt_local;
  int len_sig_local;
  double *sig_local;
  
  oup_00 = (double *)malloc((long)(len_sig + len_filt + -1) << 3);
  conv_direct(sig,len_sig,filt,len_filt,oup_00);
  for (temp._0_4_ = 0; (int)temp < len_sig; temp._0_4_ = (int)temp + 1) {
    oup[(int)temp] = oup_00[(int)temp];
  }
  free(oup_00);
  return;
}

Assistant:

void filter(double *sig, int len_sig, double *filt, int len_filt, double *oup) {
	int N,i;
	double *temp;
	/*
	 *
	 * filter returns the output which is of same length as the input
	 * unlike conv function
	 *
	 */
	
	N = len_sig + len_filt - 1;
	temp = (double*) malloc (sizeof(double) * N);
	
	conv_direct(sig,len_sig, filt, len_filt,temp);
	
	for (i = 0; i < len_sig; ++i) {
		oup[i] = temp[i];
	}
	
	free(temp);
	
	
}